

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Texturing.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Texturing_TextureTransform(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_TextureTransform *this_00;
  aiVector2D *pValue;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint pAttrIdx;
  string *psVar5;
  allocator local_b9;
  CX3DImporter_NodeElement *ne;
  float local_ac;
  aiVector2D local_a8;
  aiVector2D local_a0;
  aiVector2D local_98;
  string def;
  string use;
  string an;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  pAttrIdx = 0;
  local_98.x = 0.0;
  local_98.y = 0.0;
  use.field_2._M_local_buf[0] = '\0';
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  def.field_2._M_local_buf[0] = '\0';
  ne = (CX3DImporter_NodeElement *)0x0;
  local_a0.x = 1.0;
  local_a0.y = 1.0;
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_ac = 0.0;
  do {
    if (uVar3 == pAttrIdx) {
      if (use._M_string_length == 0) {
        this_00 = (CX3DImporter_NodeElement_TextureTransform *)operator_new(0x70);
        CX3DImporter_NodeElement_TextureTransform::CX3DImporter_NodeElement_TextureTransform
                  (this_00,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        ne[1]._vptr_CX3DImporter_NodeElement = (_func_int **)local_98;
        ne[1].Type = (EType)local_ac;
        *(aiVector2D *)&ne[1].field_0xc = local_a0;
        *(aiVector2D *)((long)&ne[1].ID._M_dataplus._M_p + 4) = local_a8;
        iVar4 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pParentElement = ne;
        if ((char)iVar4 == '\0') {
          std::__cxx11::string::string((string *)&an,"TextureTransform",&local_b9);
          ParseNode_Metadata(this,pParentElement,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        this_01 = &this->NodeElement_List;
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,&use,ENET_TextureTransform,&ne);
        if (!bVar2) {
          Throw_USE_NotFound(this,&use);
        }
        this_01 = &this->NodeElement_Cur->Child;
      }
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(this_01,&ne);
      std::__cxx11::string::~string((string *)&def);
      std::__cxx11::string::~string((string *)&use);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string((string *)&an,(char *)CONCAT44(extraout_var,iVar4),&local_b9);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar5 = &def;
LAB_00534316:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar5 = &use;
        goto LAB_00534316;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"center");
            pValue = &local_98;
            if (!bVar2) {
              bVar2 = std::operator==(&an,"rotation");
              if (bVar2) {
                local_ac = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                goto LAB_0053431e;
              }
              bVar2 = std::operator==(&an,"scale");
              pValue = &local_a0;
              if (!bVar2) {
                bVar2 = std::operator==(&an,"translation");
                pValue = &local_a8;
                if (!bVar2) {
                  Throw_IncorrectAttr(this,&an);
                  goto LAB_0053431e;
                }
              }
            }
            XML_ReadNode_GetAttrVal_AsVec2f(this,pAttrIdx,pValue);
          }
        }
      }
    }
LAB_0053431e:
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Texturing_TextureTransform()
{
    std::string use, def;
    aiVector2D center(0, 0);
    float rotation = 0;
    aiVector2D scale(1, 1);
    aiVector2D translation(0, 0);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("center", center, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_RET("rotation", rotation, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_REF("translation", translation, XML_ReadNode_GetAttrVal_AsVec2f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TextureTransform, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_TextureTransform(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_TextureTransform*)ne)->Center = center;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Rotation = rotation;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Scale = scale;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Translation = translation;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "TextureTransform");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}